

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledSpectrum pbrt::Bilerp(array<float,_2> p,span<const_pbrt::SampledSpectrum> v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  float *pfVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  SampledSpectrum SVar21;
  undefined4 in_stack_ffffffffffffff28;
  float fVar22;
  float fVar23;
  Float in_stack_ffffffffffffff34;
  float a;
  float fVar24;
  float fVar25;
  span<const_pbrt::SampledSpectrum> local_28;
  array<float,_2> local_18 [3];
  undefined1 auVar20 [56];
  
  local_18[0].values = (float  [2])vmovlpd_avx(in_ZMM0._0_16_);
  pfVar4 = pstd::array<float,_2>::operator[](local_18,0);
  fVar25 = 1.0;
  fVar22 = 1.0 - *pfVar4;
  pfVar4 = pstd::array<float,_2>::operator[](local_18,1);
  auVar20 = (undefined1  [56])0x0;
  fVar23 = fVar22 * (fVar25 - *pfVar4);
  pstd::span<const_pbrt::SampledSpectrum>::operator[](&local_28,0);
  auVar12 = (undefined1  [56])0x0;
  SVar21 = operator*(in_stack_ffffffffffffff34,
                     (SampledSpectrum *)CONCAT44(fVar22,in_stack_ffffffffffffff28));
  auVar13._0_8_ = SVar21.values.values._8_8_;
  auVar13._8_56_ = auVar20;
  auVar5._0_8_ = SVar21.values.values._0_8_;
  auVar5._8_56_ = auVar12;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar13._0_16_);
  pfVar4 = pstd::array<float,_2>::operator[](local_18,0);
  a = *pfVar4;
  pfVar4 = pstd::array<float,_2>::operator[](local_18,1);
  auVar20 = (undefined1  [56])0x0;
  fVar24 = a * (fVar25 - *pfVar4);
  pstd::span<const_pbrt::SampledSpectrum>::operator[](&local_28,1);
  auVar12 = (undefined1  [56])0x0;
  SVar21 = operator*(a,(SampledSpectrum *)CONCAT44(fVar22,in_stack_ffffffffffffff28));
  auVar14._0_8_ = SVar21.values.values._8_8_;
  auVar14._8_56_ = auVar20;
  auVar6._0_8_ = SVar21.values.values._0_8_;
  auVar6._8_56_ = auVar12;
  vmovlpd_avx(auVar6._0_16_);
  vmovlpd_avx(auVar14._0_16_);
  SVar21 = SampledSpectrum::operator+
                     ((SampledSpectrum *)CONCAT44(fVar25,fVar24),
                      (SampledSpectrum *)CONCAT44(a,fVar23));
  auVar15._0_8_ = SVar21.values.values._8_8_;
  auVar15._8_56_ = auVar20;
  auVar7._0_8_ = SVar21.values.values._0_8_;
  auVar7._8_56_ = auVar12;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  pstd::array<float,_2>::operator[](local_18,0);
  pstd::array<float,_2>::operator[](local_18,1);
  auVar20 = (undefined1  [56])0x0;
  pstd::span<const_pbrt::SampledSpectrum>::operator[](&local_28,2);
  auVar12 = (undefined1  [56])0x0;
  SVar21 = operator*(a,(SampledSpectrum *)CONCAT44(fVar22,in_stack_ffffffffffffff28));
  auVar16._0_8_ = SVar21.values.values._8_8_;
  auVar16._8_56_ = auVar20;
  auVar8._0_8_ = SVar21.values.values._0_8_;
  auVar8._8_56_ = auVar12;
  vmovlpd_avx(auVar8._0_16_);
  vmovlpd_avx(auVar16._0_16_);
  SVar21 = SampledSpectrum::operator+
                     ((SampledSpectrum *)CONCAT44(fVar25,fVar24),
                      (SampledSpectrum *)CONCAT44(a,fVar23));
  auVar17._0_8_ = SVar21.values.values._8_8_;
  auVar17._8_56_ = auVar20;
  auVar9._0_8_ = SVar21.values.values._0_8_;
  auVar9._8_56_ = auVar12;
  vmovlpd_avx(auVar9._0_16_);
  vmovlpd_avx(auVar17._0_16_);
  pstd::array<float,_2>::operator[](local_18,0);
  pstd::array<float,_2>::operator[](local_18,1);
  auVar20 = (undefined1  [56])0x0;
  pstd::span<const_pbrt::SampledSpectrum>::operator[](&local_28,3);
  auVar12 = (undefined1  [56])0x0;
  SVar21 = operator*(a,(SampledSpectrum *)CONCAT44(fVar22,in_stack_ffffffffffffff28));
  auVar18._0_8_ = SVar21.values.values._8_8_;
  auVar18._8_56_ = auVar20;
  auVar10._0_8_ = SVar21.values.values._0_8_;
  auVar10._8_56_ = auVar12;
  vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar18._0_16_);
  SVar21 = SampledSpectrum::operator+
                     ((SampledSpectrum *)CONCAT44(fVar25,fVar24),
                      (SampledSpectrum *)CONCAT44(a,fVar23));
  auVar19._0_8_ = SVar21.values.values._8_8_;
  auVar19._8_56_ = auVar20;
  auVar11._0_8_ = SVar21.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  uVar1 = vmovlpd_avx(auVar11._0_16_);
  uVar2 = vmovlpd_avx(auVar19._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum Bilerp(pstd::array<Float, 2> p,
                              pstd::span<const SampledSpectrum> v) {
    return ((1 - p[0]) * (1 - p[1]) * v[0] + p[0] * (1 - p[1]) * v[1] +
            (1 - p[0]) * p[1] * v[2] + p[0] * p[1] * v[3]);
}